

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O1

void __thiscall vkt::sr::ShaderRenderCaseInstance::setup(ShaderRenderCaseInstance *this)

{
  pointer pVVar1;
  pointer pVVar2;
  pointer pVVar3;
  DescriptorSetLayoutBuilder *this_00;
  DescriptorPoolBuilder *this_01;
  DescriptorSetUpdateBuilder *this_02;
  TextureLevel local_40;
  
  tcu::TextureLevel::TextureLevel(&local_40);
  (this->m_resultImage).m_size.m_data[2] = local_40.m_size.m_data[2];
  (this->m_resultImage).m_format = local_40.m_format;
  *(undefined8 *)(this->m_resultImage).m_size.m_data = local_40.m_size.m_data._0_8_;
  de::ArrayBuffer<unsigned_char,_1UL,_1UL>::operator=
            (&(this->m_resultImage).m_data,&local_40.m_data);
  tcu::TextureLevel::~TextureLevel(&local_40);
  this_00 = (DescriptorSetLayoutBuilder *)operator_new(0x48);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder(this_00);
  local_40.m_format.order = R;
  local_40.m_format.type = SNORM_INT8;
  if ((this->m_descriptorSetLayoutBuilder).
      super_UniqueBase<vk::DescriptorSetLayoutBuilder,_de::DefaultDeleter<vk::DescriptorSetLayoutBuilder>_>
      .m_data.ptr != this_00) {
    de::details::
    UniqueBase<vk::DescriptorSetLayoutBuilder,_de::DefaultDeleter<vk::DescriptorSetLayoutBuilder>_>
    ::reset(&(this->m_descriptorSetLayoutBuilder).
             super_UniqueBase<vk::DescriptorSetLayoutBuilder,_de::DefaultDeleter<vk::DescriptorSetLayoutBuilder>_>
           );
    (this->m_descriptorSetLayoutBuilder).
    super_UniqueBase<vk::DescriptorSetLayoutBuilder,_de::DefaultDeleter<vk::DescriptorSetLayoutBuilder>_>
    .m_data.ptr = this_00;
  }
  de::details::
  UniqueBase<vk::DescriptorSetLayoutBuilder,_de::DefaultDeleter<vk::DescriptorSetLayoutBuilder>_>::
  reset((UniqueBase<vk::DescriptorSetLayoutBuilder,_de::DefaultDeleter<vk::DescriptorSetLayoutBuilder>_>
         *)&local_40);
  this_01 = (DescriptorPoolBuilder *)operator_new(0x18);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder(this_01);
  local_40.m_format.order = R;
  local_40.m_format.type = SNORM_INT8;
  if ((this->m_descriptorPoolBuilder).
      super_UniqueBase<vk::DescriptorPoolBuilder,_de::DefaultDeleter<vk::DescriptorPoolBuilder>_>.
      m_data.ptr != this_01) {
    de::details::
    UniqueBase<vk::DescriptorPoolBuilder,_de::DefaultDeleter<vk::DescriptorPoolBuilder>_>::reset
              (&(this->m_descriptorPoolBuilder).
                super_UniqueBase<vk::DescriptorPoolBuilder,_de::DefaultDeleter<vk::DescriptorPoolBuilder>_>
              );
    (this->m_descriptorPoolBuilder).
    super_UniqueBase<vk::DescriptorPoolBuilder,_de::DefaultDeleter<vk::DescriptorPoolBuilder>_>.
    m_data.ptr = this_01;
  }
  de::details::UniqueBase<vk::DescriptorPoolBuilder,_de::DefaultDeleter<vk::DescriptorPoolBuilder>_>
  ::reset((UniqueBase<vk::DescriptorPoolBuilder,_de::DefaultDeleter<vk::DescriptorPoolBuilder>_> *)
          &local_40);
  this_02 = (DescriptorSetUpdateBuilder *)operator_new(0x48);
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder(this_02);
  local_40.m_format.order = R;
  local_40.m_format.type = SNORM_INT8;
  if ((this->m_descriptorSetUpdateBuilder).
      super_UniqueBase<vk::DescriptorSetUpdateBuilder,_de::DefaultDeleter<vk::DescriptorSetUpdateBuilder>_>
      .m_data.ptr != this_02) {
    de::details::
    UniqueBase<vk::DescriptorSetUpdateBuilder,_de::DefaultDeleter<vk::DescriptorSetUpdateBuilder>_>
    ::reset(&(this->m_descriptorSetUpdateBuilder).
             super_UniqueBase<vk::DescriptorSetUpdateBuilder,_de::DefaultDeleter<vk::DescriptorSetUpdateBuilder>_>
           );
    (this->m_descriptorSetUpdateBuilder).
    super_UniqueBase<vk::DescriptorSetUpdateBuilder,_de::DefaultDeleter<vk::DescriptorSetUpdateBuilder>_>
    .m_data.ptr = this_02;
  }
  de::details::
  UniqueBase<vk::DescriptorSetUpdateBuilder,_de::DefaultDeleter<vk::DescriptorSetUpdateBuilder>_>::
  reset((UniqueBase<vk::DescriptorSetUpdateBuilder,_de::DefaultDeleter<vk::DescriptorSetUpdateBuilder>_>
         *)&local_40);
  std::
  vector<de::SharedPtr<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>_>,_std::allocator<de::SharedPtr<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>_>_>_>
  ::_M_erase_at_end(&this->m_uniformInfos,
                    (this->m_uniformInfos).
                    super__Vector_base<de::SharedPtr<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>_>,_std::allocator<de::SharedPtr<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  pVVar1 = (this->m_vertexBindingDescription).
           super__Vector_base<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_vertexBindingDescription).
      super__Vector_base<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
      ._M_impl.super__Vector_impl_data._M_finish != pVVar1) {
    (this->m_vertexBindingDescription).
    super__Vector_base<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
    ._M_impl.super__Vector_impl_data._M_finish = pVVar1;
  }
  pVVar2 = (this->m_vertexAttributeDescription).
           super__Vector_base<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_vertexAttributeDescription).
      super__Vector_base<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
      ._M_impl.super__Vector_impl_data._M_finish != pVVar2) {
    (this->m_vertexAttributeDescription).
    super__Vector_base<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
    ._M_impl.super__Vector_impl_data._M_finish = pVVar2;
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
  ::_M_erase_at_end(&this->m_vertexBuffers,
                    (this->m_vertexBuffers).
                    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  std::vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>::
  _M_erase_at_end(&this->m_vertexBufferAllocs,
                  (this->m_vertexBufferAllocs).
                  super__Vector_base<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
                  ._M_impl.super__Vector_impl_data._M_start);
  pVVar3 = (this->m_pushConstantRanges).
           super__Vector_base<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_pushConstantRanges).
      super__Vector_base<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>._M_impl.
      super__Vector_impl_data._M_finish != pVVar3) {
    (this->m_pushConstantRanges).
    super__Vector_base<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>._M_impl.
    super__Vector_impl_data._M_finish = pVVar3;
  }
  return;
}

Assistant:

void ShaderRenderCaseInstance::setup (void)
{
	m_resultImage					= tcu::TextureLevel();
	m_descriptorSetLayoutBuilder	= de::MovePtr<DescriptorSetLayoutBuilder>	(new DescriptorSetLayoutBuilder());
	m_descriptorPoolBuilder			= de::MovePtr<DescriptorPoolBuilder>		(new DescriptorPoolBuilder());
	m_descriptorSetUpdateBuilder	= de::MovePtr<DescriptorSetUpdateBuilder>	(new DescriptorSetUpdateBuilder());

	m_uniformInfos.clear();
	m_vertexBindingDescription.clear();
	m_vertexAttributeDescription.clear();
	m_vertexBuffers.clear();
	m_vertexBufferAllocs.clear();
	m_pushConstantRanges.clear();
}